

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTemplate.cpp
# Opt level: O0

uint8_t __thiscall ki::protocol::dml::MessageTemplate::get_access_level(MessageTemplate *this)

{
  Record *this_00;
  Field<unsigned_char> *this_01;
  allocator local_41;
  string local_40 [32];
  Field<unsigned_char> *local_20;
  Field<unsigned_char> *field;
  MessageTemplate *this_local;
  
  this_00 = this->m_record;
  field = (Field<unsigned_char> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"_MsgAccessLvl",&local_41);
  this_01 = ki::dml::Record::get_field<unsigned_char>(this_00,(string *)local_40);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (this_01 == (Field<unsigned_char> *)0x0) {
    this_local._7_1_ = '\0';
  }
  else {
    local_20 = this_01;
    this_local._7_1_ = ki::dml::Field<unsigned_char>::get_value(this_01);
  }
  return this_local._7_1_;
}

Assistant:

uint8_t MessageTemplate::get_access_level() const
	{
		const auto field = m_record->get_field<ki::dml::UBYT>("_MsgAccessLvl");
		if (field)
			return field->get_value();
		return 0;
	}